

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jcapimin.c
# Opt level: O0

void jpeg_write_m_header(j_compress_ptr cinfo,int marker,uint datalen)

{
  undefined4 in_EDX;
  undefined4 in_ESI;
  long *in_RDI;
  
  if ((*(int *)((long)in_RDI + 0x154) != 0) ||
     (((*(int *)((long)in_RDI + 0x24) != 0x65 && (*(int *)((long)in_RDI + 0x24) != 0x66)) &&
      (*(int *)((long)in_RDI + 0x24) != 0x67)))) {
    *(undefined4 *)(*in_RDI + 0x28) = 0x15;
    *(undefined4 *)(*in_RDI + 0x2c) = *(undefined4 *)((long)in_RDI + 0x24);
    (**(code **)*in_RDI)(in_RDI);
  }
  (**(code **)(in_RDI[0x42] + 0x28))(in_RDI,in_ESI,in_EDX);
  return;
}

Assistant:

GLOBAL(void)
jpeg_write_m_header (j_compress_ptr cinfo, int marker, unsigned int datalen)
{
  if (cinfo->next_scanline != 0 ||
      (cinfo->global_state != CSTATE_SCANNING &&
       cinfo->global_state != CSTATE_RAW_OK &&
       cinfo->global_state != CSTATE_WRCOEFS))
    ERREXIT1(cinfo, JERR_BAD_STATE, cinfo->global_state);

  (*cinfo->marker->write_marker_header) (cinfo, marker, datalen);
}